

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void kj::_::Debug::
     log<char_const(&)[46],kj::_::DebugComparison<bool,bool>&,bool,kj::StringPtr&,kj::String&>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [46],
               DebugComparison<bool,_bool> *params_1,bool *params_2,StringPtr *params_3,
               String *params_4)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  ArrayPtr<kj::String> argValues_00;
  undefined4 in_register_00000014;
  bool *params_00;
  StringPtr *params_01;
  String *params_02;
  long lVar4;
  String argValues [5];
  size_t in_stack_ffffffffffffff40;
  String local_a8 [2];
  String local_78;
  String local_60;
  String local_48;
  
  str<char_const(&)[46]>
            (local_a8,(kj *)params,(char (*) [46])CONCAT44(in_register_00000014,severity));
  _::operator*(&stack0xffffffffffffff40,params_1);
  str<bool&>(&local_78,(kj *)params_2,params_00);
  str<kj::StringPtr&>(&local_60,(kj *)params_3,params_01);
  str<kj::String&>(&local_48,(kj *)params_4,params_02);
  argValues_00.size_ = in_stack_ffffffffffffff40;
  argValues_00.ptr = (String *)macroArgs;
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              (char *)local_a8,argValues_00);
  lVar4 = 0x60;
  do {
    lVar1 = *(long *)((long)&local_a8[0].content.ptr + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_a8[0].content.size_ + lVar4);
      *(undefined8 *)((long)&local_a8[0].content.ptr + lVar4) = 0;
      *(undefined8 *)((long)&local_a8[0].content.size_ + lVar4) = 0;
      puVar3 = *(undefined8 **)((long)&local_a8[0].content.disposer + lVar4);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}